

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O2

void __thiscall TTD::ScriptContextTTD::ScriptContextTTD(ScriptContextTTD *this,ScriptContext *ctx)

{
  Recycler *this_00;
  Recycler *pRVar1;
  BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *this_01;
  BaseDictionary<Js::RecyclableObject_*,_Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *this_02;
  undefined1 local_70 [8];
  TrackAllocData data;
  
  this->m_ctx = ctx;
  (this->m_ttdPendingAsyncModList).
  super_ReadOnlyList<TTD::TTDPendingAsyncBufferModification,_Memory::HeapAllocator,_DefaultComparer>
  .alloc = &Memory::HeapAllocator::Instance;
  (this->m_ttdPendingAsyncModList).
  super_ReadOnlyList<TTD::TTDPendingAsyncBufferModification,_Memory::HeapAllocator,_DefaultComparer>
  ._vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_013828f8;
  (this->m_ttdPendingAsyncModList).
  super_ReadOnlyList<TTD::TTDPendingAsyncBufferModification,_Memory::HeapAllocator,_DefaultComparer>
  .buffer = (Type)0x0;
  (this->m_ttdPendingAsyncModList).
  super_ReadOnlyList<TTD::TTDPendingAsyncBufferModification,_Memory::HeapAllocator,_DefaultComparer>
  .count = 0;
  (this->m_ttdPendingAsyncModList).length = 0;
  (this->m_ttdPendingAsyncModList).increment = 4;
  (this->m_ttdTopLevelScriptLoad).buckets = (Type)0x0;
  (this->m_ttdTopLevelScriptLoad).entries = (Type)0x0;
  (this->m_ttdTopLevelScriptLoad).alloc = &Memory::HeapAllocator::Instance;
  (this->m_ttdTopLevelScriptLoad).size = 0;
  (this->m_ttdTopLevelScriptLoad).bucketCount = 0;
  (this->m_ttdTopLevelScriptLoad).count = 0;
  (this->m_ttdTopLevelScriptLoad).freeCount = 0;
  (this->m_ttdTopLevelScriptLoad).modFunctionIndex = 0x4b;
  (this->m_ttdTopLevelScriptLoad).stats = (Type)0x0;
  (this->m_ttdTopLevelNewFunction).buckets = (Type)0x0;
  (this->m_ttdTopLevelNewFunction).entries = (Type)0x0;
  (this->m_ttdTopLevelNewFunction).alloc = &Memory::HeapAllocator::Instance;
  (this->m_ttdTopLevelNewFunction).size = 0;
  (this->m_ttdTopLevelNewFunction).bucketCount = 0;
  (this->m_ttdTopLevelNewFunction).count = 0;
  (this->m_ttdTopLevelNewFunction).freeCount = 0;
  (this->m_ttdTopLevelNewFunction).modFunctionIndex = 0x4b;
  (this->m_ttdTopLevelNewFunction).stats = (Type)0x0;
  (this->m_ttdTopLevelEval).buckets = (Type)0x0;
  (this->m_ttdTopLevelEval).entries = (Type)0x0;
  (this->m_ttdTopLevelEval).alloc = &Memory::HeapAllocator::Instance;
  (this->m_ttdTopLevelEval).size = 0;
  (this->m_ttdTopLevelEval).bucketCount = 0;
  (this->m_ttdTopLevelEval).count = 0;
  (this->m_ttdTopLevelEval).freeCount = 0;
  (this->m_ttdTopLevelEval).modFunctionIndex = 0x4b;
  (this->m_ttdFunctionBodyParentMap).buckets = (Type)0x0;
  (this->m_ttdFunctionBodyParentMap).entries = (Type)0x0;
  (this->m_ttdTopLevelEval).stats = (Type)0x0;
  (this->m_ttdPinnedRootFunctionSet).ptr =
       (BaseHashSet<Js::FunctionBody_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FunctionBody_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
        *)0x0;
  (this->m_ttdFunctionBodyParentMap).alloc = &Memory::HeapAllocator::Instance;
  (this->m_ttdFunctionBodyParentMap).size = 0;
  (this->m_ttdFunctionBodyParentMap).bucketCount = 0;
  (this->m_ttdFunctionBodyParentMap).count = 0;
  (this->m_ttdFunctionBodyParentMap).freeCount = 0;
  (this->m_ttdFunctionBodyParentMap).modFunctionIndex = 0x4b;
  (this->m_ttdFunctionBodyParentMap).stats = (Type)0x0;
  (this->TTDWeakReferencePinSet).ptr =
       (BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
        *)0x0;
  this_00 = ctx->recycler;
  local_70 = (undefined1  [8])
             &JsUtil::
              BaseHashSet<Js::FunctionBody*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::FunctionBody*,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
              ::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_408dc1c;
  data.filename._0_4_ = 0x13a;
  pRVar1 = Memory::Recycler::TrackAllocInfo(this_00,(TrackAllocData *)local_70);
  this_01 = (BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
             *)new<Memory::Recycler>(0x38,pRVar1,0x37a1d4);
  JsUtil::
  BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(this_01,this_00,0);
  Memory::
  RecyclerRootPtr<JsUtil::BaseHashSet<Js::FunctionBody_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FunctionBody_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
  ::Root(&this->m_ttdPinnedRootFunctionSet,
         (BaseHashSet<Js::FunctionBody_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FunctionBody_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          *)this_01,this_00);
  local_70 = (undefined1  [8])
             &JsUtil::
              BaseHashSet<Js::RecyclableObject*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::RecyclableObject*,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
              ::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_408dc1c;
  data.filename._0_4_ = 0x13b;
  pRVar1 = Memory::Recycler::TrackAllocInfo(this_00,(TrackAllocData *)local_70);
  this_02 = (BaseDictionary<Js::RecyclableObject_*,_Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
             *)new<Memory::Recycler>(0x38,pRVar1,0x37a1d4);
  JsUtil::
  BaseDictionary<Js::RecyclableObject_*,_Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(this_02,this_00,0);
  Memory::
  RecyclerRootPtr<JsUtil::BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
  ::Root(&this->TTDWeakReferencePinSet,
         (BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          *)this_02,this_00);
  return;
}

Assistant:

ScriptContextTTD::ScriptContextTTD(Js::ScriptContext* ctx)
        : m_ctx(ctx),
        m_ttdPendingAsyncModList(&HeapAllocator::Instance),
        m_ttdTopLevelScriptLoad(&HeapAllocator::Instance), m_ttdTopLevelNewFunction(&HeapAllocator::Instance), m_ttdTopLevelEval(&HeapAllocator::Instance),
        m_ttdFunctionBodyParentMap(&HeapAllocator::Instance)
    {
        Recycler* ctxRecycler = this->m_ctx->GetRecycler();

        this->m_ttdPinnedRootFunctionSet.Root(RecyclerNew(ctxRecycler, TTD::FunctionBodyPinSet, ctxRecycler), ctxRecycler);
        this->TTDWeakReferencePinSet.Root(RecyclerNew(ctxRecycler, TTD::ObjectPinSet, ctxRecycler), ctxRecycler);
    }